

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O1

bool __thiscall
QOpenGLTextureBlitterPrivate::buildProgram
          (QOpenGLTextureBlitterPrivate *this,ProgramIndex idx,char *vs,char *fs)

{
  QOpenGLShaderProgram *pQVar1;
  QDebug this_00;
  bool bVar2;
  GLuint GVar3;
  QOpenGLShaderProgram *this_01;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  Program *pPVar4;
  long in_FS_OFFSET;
  double __x;
  QByteArrayView QVar5;
  QDebug local_48;
  QString local_40;
  long local_28;
  
  __len = (socklen_t)fs;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar4 = this->programs + idx;
  this_01 = (QOpenGLShaderProgram *)operator_new(0x10);
  QOpenGLShaderProgram::QOpenGLShaderProgram(this_01,(QObject *)0x0);
  pQVar1 = (pPVar4->glProgram).d;
  if ((pQVar1 != this_01) &&
     ((pPVar4->glProgram).d = this_01, pQVar1 != (QOpenGLShaderProgram *)0x0)) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  QOpenGLShaderProgram::addCacheableShaderFromSourceCode((pPVar4->glProgram).d,(ShaderType)0x1,vs);
  __fd = 2;
  QOpenGLShaderProgram::addCacheableShaderFromSourceCode((pPVar4->glProgram).d,(ShaderType)0x2,fs);
  (**(code **)(*(long *)(pPVar4->glProgram).d + 0x60))();
  bVar2 = QOpenGLShaderProgram::isLinked((pPVar4->glProgram).d);
  if (bVar2) {
    QOpenGLShaderProgram::bind((pPVar4->glProgram).d,__fd,__addr,__len);
    GVar3 = QOpenGLShaderProgram::attributeLocation((pPVar4->glProgram).d,"vertexCoord");
    this->programs[idx].vertexCoordAttribPos = GVar3;
    GVar3 = QOpenGLShaderProgram::uniformLocation((pPVar4->glProgram).d,"vertexTransform");
    this->programs[idx].vertexTransformUniformPos = GVar3;
    GVar3 = QOpenGLShaderProgram::attributeLocation((pPVar4->glProgram).d,"textureCoord");
    this->programs[idx].textureCoordAttribPos = GVar3;
    GVar3 = QOpenGLShaderProgram::uniformLocation((pPVar4->glProgram).d,"textureTransform");
    this->programs[idx].textureTransformUniformPos = GVar3;
    GVar3 = QOpenGLShaderProgram::uniformLocation((pPVar4->glProgram).d,"swizzle");
    this->programs[idx].swizzleUniformPos = GVar3;
    GVar3 = QOpenGLShaderProgram::uniformLocation((pPVar4->glProgram).d,"opacity");
    this->programs[idx].opacityUniformPos = GVar3;
    QOpenGLShaderProgram::setUniformValue
              ((pPVar4->glProgram).d,this->programs[idx].swizzleUniformPos,0);
    QOpenGLShaderProgram::release((pPVar4->glProgram).d);
  }
  else {
    QMessageLogger::warning();
    this_00.stream = local_48.stream;
    QVar5.m_data = (storage_type *)0x1f;
    QVar5.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar5);
    __x = (double)QTextStream::operator<<((QTextStream *)this_00.stream,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        __x = (double)QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      __x = (double)QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    QOpenGLShaderProgram::log((QOpenGLShaderProgram *)&local_40,__x);
    if (local_40.d.ptr == (char16_t *)0x0) {
      local_40.d.ptr = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_48,(ulong)local_40.d.ptr);
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    QDebug::~QDebug(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLTextureBlitterPrivate::buildProgram(ProgramIndex idx, const char *vs, const char *fs)
{
    Program *p = &programs[idx];

    p->glProgram.reset(new QOpenGLShaderProgram);

    p->glProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Vertex, vs);
    p->glProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Fragment, fs);
    p->glProgram->link();
    if (!p->glProgram->isLinked()) {
        qWarning() << "Could not link shader program:\n" << p->glProgram->log();
        return false;
    }

    p->glProgram->bind();

    p->vertexCoordAttribPos = p->glProgram->attributeLocation("vertexCoord");
    p->vertexTransformUniformPos = p->glProgram->uniformLocation("vertexTransform");
    p->textureCoordAttribPos = p->glProgram->attributeLocation("textureCoord");
    p->textureTransformUniformPos = p->glProgram->uniformLocation("textureTransform");
    p->swizzleUniformPos = p->glProgram->uniformLocation("swizzle");
    p->opacityUniformPos = p->glProgram->uniformLocation("opacity");

    p->glProgram->setUniformValue(p->swizzleUniformPos, false);

    // minmize state left set after a create()
    p->glProgram->release();

    return true;
}